

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugLine::ParsingState::appendRowToMatrix(ParsingState *this)

{
  bool bVar1;
  size_type sVar2;
  uint RowNumber;
  ParsingState *this_local;
  
  sVar2 = std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>::size
                    (&this->LineTable->Rows);
  if (((this->Sequence).Empty & 1U) != 0) {
    (this->Sequence).Empty = false;
    (this->Sequence).LowPC = (this->Row).Address.Address;
    (this->Sequence).FirstRowIndex = (uint)sVar2;
  }
  LineTable::appendRow(this->LineTable,&this->Row);
  if (((byte)(this->Row).field_0x1d >> 2 & 1) != 0) {
    (this->Sequence).HighPC = (this->Row).Address.Address;
    (this->Sequence).LastRowIndex = (uint)sVar2 + 1;
    (this->Sequence).SectionIndex = (this->Row).Address.SectionIndex;
    bVar1 = Sequence::isValid(&this->Sequence);
    if (bVar1) {
      LineTable::appendSequence(this->LineTable,&this->Sequence);
    }
    Sequence::reset(&this->Sequence);
  }
  Row::postAppend(&this->Row);
  return;
}

Assistant:

void DWARFDebugLine::ParsingState::appendRowToMatrix() {
  unsigned RowNumber = LineTable->Rows.size();
  if (Sequence.Empty) {
    // Record the beginning of instruction sequence.
    Sequence.Empty = false;
    Sequence.LowPC = Row.Address.Address;
    Sequence.FirstRowIndex = RowNumber;
  }
  LineTable->appendRow(Row);
  if (Row.EndSequence) {
    // Record the end of instruction sequence.
    Sequence.HighPC = Row.Address.Address;
    Sequence.LastRowIndex = RowNumber + 1;
    Sequence.SectionIndex = Row.Address.SectionIndex;
    if (Sequence.isValid())
      LineTable->appendSequence(Sequence);
    Sequence.reset();
  }
  Row.postAppend();
}